

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

void __thiscall cfd::core::Script::Script(Script *this,ByteData *bytedata,bool ignore_size_check)

{
  ByteData *in_stack_ffffffffffffffc0;
  bool ignore_size_check_local;
  ByteData *bytedata_local;
  Script *this_local;
  
  this->_vptr_Script = (_func_int **)&PTR__Script_00b56090;
  ByteData::ByteData(in_stack_ffffffffffffffc0,&this->script_data_);
  (this->script_stack_).
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->script_stack_).
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->script_stack_).
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&this->script_stack_);
  SetStackData(this,bytedata,ignore_size_check);
  return;
}

Assistant:

Script::Script(const ByteData& bytedata, bool ignore_size_check)
    : script_data_(bytedata), script_stack_() {
  SetStackData(bytedata, ignore_size_check);
}